

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCheckedActualCall_unExpectedCallWithAParameter_Test::testBody
          (TEST_MockCheckedActualCall_unExpectedCallWithAParameter_Test *this)

{
  MockActualCall *pMVar1;
  UtestShell *test;
  SimpleString local_e0;
  MockUnexpectedCallHappenedFailure expectedFailure;
  MockCheckedActualCall actualCall;
  
  MockCheckedActualCall::MockCheckedActualCall
            (&actualCall,1,(this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).emptyList);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"unexpected");
  pMVar1 = MockCheckedActualCall::withName(&actualCall,(SimpleString *)&expectedFailure);
  SimpleString::SimpleString(&local_e0,"bar");
  (*pMVar1->_vptr_MockActualCall[8])(pMVar1,&local_e0,0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_e0,"unexpected");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            (&expectedFailure,test,&local_e0,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::~SimpleString(&local_e0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x4a);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockCheckedActualCall::~MockCheckedActualCall(&actualCall);
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedCallWithAParameter)
{
    MockCheckedActualCall actualCall(1, reporter, *emptyList);
    actualCall.withName("unexpected").withParameter("bar", 0);

    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "unexpected", *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}